

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFHighLevelEncoder.cpp
# Opt level: O0

int ZXing::Pdf417::EncodeText
              (wstring *msg,int startpos,int count,int submode,
              vector<int,_std::allocator<int>_> *output)

{
  int ch_00;
  bool bVar1;
  int *piVar2;
  size_type sVar3;
  reference pvVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  ulong in_RDI;
  bool odd;
  size_t i;
  size_t len;
  int h;
  int next;
  int ch;
  int idx;
  vector<int,_std::allocator<int>_> tmp;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff25;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  undefined1 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff29;
  undefined1 in_stack_ffffffffffffff2a;
  undefined1 in_stack_ffffffffffffff2b;
  int in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff31;
  undefined1 in_stack_ffffffffffffff32;
  undefined1 in_stack_ffffffffffffff33;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff50;
  ulong __n;
  int local_a0;
  int local_48;
  vector<int,_std::allocator<int>_> local_38;
  int local_14;
  int local_10;
  int local_c;
  ulong local_8;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2dcc9e);
  std::vector<int,_std::allocator<int>_>::reserve
            (in_stack_ffffffffffffff50,CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
            );
  local_48 = 0;
LAB_002dccbd:
  do {
    piVar2 = (int *)std::__cxx11::wstring::operator[](local_8);
    ch_00 = *piVar2;
    if (local_14 == 0) {
      bVar1 = IsAlphaUpper(ch_00);
      if (bVar1) {
        if (ch_00 == 0x20) {
          in_stack_ffffffffffffff34 = 0x1a;
        }
        else {
          in_stack_ffffffffffffff34 = ch_00 + -0x41;
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffff27,
                            CONCAT16(in_stack_ffffffffffffff26,
                                     CONCAT15(in_stack_ffffffffffffff25,
                                              CONCAT14(in_stack_ffffffffffffff24,
                                                       in_stack_ffffffffffffff20)))),
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      }
      else {
        in_stack_ffffffffffffff33 = IsAlphaLower(ch_00);
        if ((bool)in_stack_ffffffffffffff33) {
          local_14 = 1;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,
                                       CONCAT15(in_stack_ffffffffffffff25,
                                                CONCAT14(in_stack_ffffffffffffff24,
                                                         in_stack_ffffffffffffff20)))),
                     (value_type_conflict3 *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          goto LAB_002dccbd;
        }
        in_stack_ffffffffffffff32 = IsMixed(ch_00);
        if ((bool)in_stack_ffffffffffffff32) {
          local_14 = 2;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,
                                       CONCAT15(in_stack_ffffffffffffff25,
                                                CONCAT14(in_stack_ffffffffffffff24,
                                                         in_stack_ffffffffffffff20)))),
                     (value_type_conflict3 *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          goto LAB_002dccbd;
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffff27,
                            CONCAT16(in_stack_ffffffffffffff26,
                                     CONCAT15(in_stack_ffffffffffffff25,
                                              CONCAT14(in_stack_ffffffffffffff24,
                                                       in_stack_ffffffffffffff20)))),
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffff27,
                            CONCAT16(in_stack_ffffffffffffff26,
                                     CONCAT15(in_stack_ffffffffffffff25,
                                              CONCAT14(in_stack_ffffffffffffff24,
                                                       in_stack_ffffffffffffff20)))),
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      }
    }
    else if (local_14 == 1) {
      in_stack_ffffffffffffff31 = IsAlphaLower(ch_00);
      if ((bool)in_stack_ffffffffffffff31) {
        if (ch_00 == 0x20) {
          in_stack_ffffffffffffff2c = 0x1a;
        }
        else {
          in_stack_ffffffffffffff2c = ch_00 + -0x61;
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffff27,
                            CONCAT16(in_stack_ffffffffffffff26,
                                     CONCAT15(in_stack_ffffffffffffff25,
                                              CONCAT14(in_stack_ffffffffffffff24,
                                                       in_stack_ffffffffffffff20)))),
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      }
      else {
        in_stack_ffffffffffffff2b = IsAlphaUpper(ch_00);
        if ((bool)in_stack_ffffffffffffff2b) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,
                                       CONCAT15(in_stack_ffffffffffffff25,
                                                CONCAT14(in_stack_ffffffffffffff24,
                                                         in_stack_ffffffffffffff20)))),
                     (value_type_conflict3 *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,
                                       CONCAT15(in_stack_ffffffffffffff25,
                                                CONCAT14(in_stack_ffffffffffffff24,
                                                         in_stack_ffffffffffffff20)))),
                     (value_type_conflict3 *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        }
        else {
          in_stack_ffffffffffffff2a = IsMixed(ch_00);
          if ((bool)in_stack_ffffffffffffff2a) {
            local_14 = 2;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,
                                         CONCAT15(in_stack_ffffffffffffff25,
                                                  CONCAT14(in_stack_ffffffffffffff24,
                                                           in_stack_ffffffffffffff20)))),
                       (value_type_conflict3 *)
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
            goto LAB_002dccbd;
          }
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,
                                       CONCAT15(in_stack_ffffffffffffff25,
                                                CONCAT14(in_stack_ffffffffffffff24,
                                                         in_stack_ffffffffffffff20)))),
                     (value_type_conflict3 *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,
                                       CONCAT15(in_stack_ffffffffffffff25,
                                                CONCAT14(in_stack_ffffffffffffff24,
                                                         in_stack_ffffffffffffff20)))),
                     (value_type_conflict3 *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        }
      }
    }
    else if (local_14 == 2) {
      in_stack_ffffffffffffff29 = IsMixed(ch_00);
      if ((bool)in_stack_ffffffffffffff29) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffff27,
                            CONCAT16(in_stack_ffffffffffffff26,
                                     CONCAT15(in_stack_ffffffffffffff25,
                                              CONCAT14(in_stack_ffffffffffffff24,
                                                       in_stack_ffffffffffffff20)))),
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      }
      else {
        in_stack_ffffffffffffff28 = IsAlphaUpper(ch_00);
        if ((bool)in_stack_ffffffffffffff28) {
          local_14 = 0;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,
                                       CONCAT15(in_stack_ffffffffffffff25,
                                                CONCAT14(in_stack_ffffffffffffff24,
                                                         in_stack_ffffffffffffff20)))),
                     (value_type_conflict3 *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          goto LAB_002dccbd;
        }
        in_stack_ffffffffffffff27 = IsAlphaLower(ch_00);
        if ((bool)in_stack_ffffffffffffff27) {
          local_14 = 1;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,
                                       CONCAT15(in_stack_ffffffffffffff25,
                                                CONCAT14(in_stack_ffffffffffffff24,
                                                         in_stack_ffffffffffffff20)))),
                     (value_type_conflict3 *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          goto LAB_002dccbd;
        }
        if (local_c + local_48 + 1 < local_10) {
          piVar2 = (int *)std::__cxx11::wstring::operator[](local_8);
          in_stack_ffffffffffffff26 = IsPunctuation(*piVar2);
          if ((bool)in_stack_ffffffffffffff26) {
            local_14 = 3;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,
                                         CONCAT15(in_stack_ffffffffffffff25,
                                                  CONCAT14(in_stack_ffffffffffffff24,
                                                           in_stack_ffffffffffffff20)))),
                       (value_type_conflict3 *)
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
            goto LAB_002dccbd;
          }
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffff27,
                            CONCAT16(in_stack_ffffffffffffff26,
                                     CONCAT15(in_stack_ffffffffffffff25,
                                              CONCAT14(in_stack_ffffffffffffff24,
                                                       in_stack_ffffffffffffff20)))),
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffff27,
                            CONCAT16(in_stack_ffffffffffffff26,
                                     CONCAT15(in_stack_ffffffffffffff25,
                                              CONCAT14(in_stack_ffffffffffffff24,
                                                       in_stack_ffffffffffffff20)))),
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      }
    }
    else {
      in_stack_ffffffffffffff25 = IsPunctuation(ch_00);
      if (!(bool)in_stack_ffffffffffffff25) {
        local_14 = 0;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffff27,
                            CONCAT16(in_stack_ffffffffffffff26,
                                     CONCAT15(in_stack_ffffffffffffff25,
                                              CONCAT14(in_stack_ffffffffffffff24,
                                                       in_stack_ffffffffffffff20)))),
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        goto LAB_002dccbd;
      }
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_ffffffffffffff27,
                          CONCAT16(in_stack_ffffffffffffff26,
                                   CONCAT15(in_stack_ffffffffffffff25,
                                            CONCAT14(in_stack_ffffffffffffff24,
                                                     in_stack_ffffffffffffff20)))),
                 (value_type_conflict3 *)
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    }
    local_48 = local_48 + 1;
    if (local_10 <= local_48) {
      local_a0 = 0;
      sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_38);
      for (__n = 0; __n < sVar3; __n = __n + 1) {
        if ((__n & 1) == 0) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,__n);
          local_a0 = *pvVar4;
        }
        else {
          in_stack_ffffffffffffff20 = local_a0 * 0x1e;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,__n);
          local_a0 = in_stack_ffffffffffffff20 + *pvVar4;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffff34,
                              CONCAT13(in_stack_ffffffffffffff33,
                                       CONCAT12(in_stack_ffffffffffffff32,
                                                CONCAT11(in_stack_ffffffffffffff31,
                                                         in_stack_ffffffffffffff30)))),
                     (value_type_conflict3 *)
                     CONCAT44(in_stack_ffffffffffffff2c,
                              CONCAT13(in_stack_ffffffffffffff2b,
                                       CONCAT12(in_stack_ffffffffffffff2a,
                                                CONCAT11(in_stack_ffffffffffffff29,
                                                         in_stack_ffffffffffffff28)))));
        }
      }
      if ((sVar3 & 1) != 0) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffff27,
                            CONCAT16(in_stack_ffffffffffffff26,
                                     CONCAT15(in_stack_ffffffffffffff25,
                                              CONCAT14(in_stack_ffffffffffffff24,
                                                       in_stack_ffffffffffffff20)))),
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff34,
                          CONCAT13(in_stack_ffffffffffffff33,
                                   CONCAT12(in_stack_ffffffffffffff32,
                                            CONCAT11(in_stack_ffffffffffffff31,
                                                     in_stack_ffffffffffffff30)))));
      return local_14;
    }
  } while( true );
}

Assistant:

static int EncodeText(const std::wstring& msg, int startpos, int count, int submode, std::vector<int>& output)
{
	std::vector<int> tmp;
	tmp.reserve(count);
	int idx = 0;
	while (true) {
		int ch = msg[startpos + idx];
		switch (submode) {
		case SUBMODE_ALPHA:
			if (IsAlphaUpper(ch)) {
				tmp.push_back(ch == ' ' ? 26 : (ch - 65)); // space
			} else if (IsAlphaLower(ch)) {
				submode = SUBMODE_LOWER;
				tmp.push_back(27); // ll
				continue;
			} else if (IsMixed(ch)) {
				submode = SUBMODE_MIXED;
				tmp.push_back(28); // ml
				continue;
			} else {
				tmp.push_back(29); // ps
				tmp.push_back(PUNCTUATION[ch]);
			}
			break;
		case SUBMODE_LOWER:
			if (IsAlphaLower(ch)) {
				tmp.push_back(ch == ' ' ? 26 : (ch - 97)); // space
			} else if (IsAlphaUpper(ch)) {
				tmp.push_back(27); // as
				tmp.push_back(ch - 65);
				// space cannot happen here, it is also in "Lower"
			} else if (IsMixed(ch)) {
				submode = SUBMODE_MIXED;
				tmp.push_back(28); // ml
				continue;
			} else {
				tmp.push_back(29); // ps
				tmp.push_back(PUNCTUATION[ch]);
			}
			break;
		case SUBMODE_MIXED:
			if (IsMixed(ch)) {
				tmp.push_back(MIXED[ch]);
			} else if (IsAlphaUpper(ch)) {
				submode = SUBMODE_ALPHA;
				tmp.push_back(28); // al
				continue;
			} else if (IsAlphaLower(ch)) {
				submode = SUBMODE_LOWER;
				tmp.push_back(27); // ll
				continue;
			} else {
				if (startpos + idx + 1 < count) {
					int next = msg[startpos + idx + 1];
					if (IsPunctuation(next)) {
						submode = SUBMODE_PUNCTUATION;
						tmp.push_back(25); // pl
						continue;
					}
				}
				tmp.push_back(29); // ps
				tmp.push_back(PUNCTUATION[ch]);
			}
			break;
		default: // SUBMODE_PUNCTUATION
			if (IsPunctuation(ch)) {
				tmp.push_back(PUNCTUATION[ch]);
			} else {
				submode = SUBMODE_ALPHA;
				tmp.push_back(29); // al
				continue;
			}
		}
		idx++;
		if (idx >= count) {
			break;
		}
	}
	int h = 0;
	size_t len = tmp.size();
	for (size_t i = 0; i < len; i++) {
		bool odd = (i % 2) != 0;
		if (odd) {
			h = (h * 30) + tmp[i];
			output.push_back(h);
		}
		else {
			h = tmp[i];
		}
	}
	if ((len % 2) != 0) {
		output.push_back((h * 30) + 29); //ps
	}
	return submode;
}